

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O1

double __thiscall ON_EarthAnchorPoint::KMLOrientationRollAngleDegrees(ON_EarthAnchorPoint *this)

{
  double dVar1;
  bool bVar2;
  double roll_degrees;
  double tilt_degrees;
  double heading_degrees;
  ON_Xform rot;
  double local_b8;
  double local_b0;
  double local_a8;
  ON_Xform local_a0;
  
  dVar1 = ON_DBL_QNAN;
  local_a8 = ON_DBL_QNAN;
  local_b0 = ON_DBL_QNAN;
  local_b8 = ON_DBL_QNAN;
  Internal_KMLOrientationXform(&local_a0,this);
  bVar2 = ON_Xform::GetKMLOrientationAnglesDegrees(&local_a0,&local_a8,&local_b0,&local_b8);
  if (!bVar2) {
    local_b8 = dVar1;
  }
  return local_b8;
}

Assistant:

const double ON_EarthAnchorPoint::KMLOrientationRollAngleDegrees() const
{
  double heading_degrees = ON_DBL_QNAN;
  double tilt_degrees = ON_DBL_QNAN;
  double roll_degrees = ON_DBL_QNAN;
  const bool rc = GetKMLOrientationAnglesDegrees(heading_degrees, tilt_degrees, roll_degrees);
  return rc ? roll_degrees : ON_DBL_QNAN;
}